

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# layout.c++
# Opt level: O1

Reader __thiscall capnp::_::ListReader::asText(ListReader *this)

{
  byte *pbVar1;
  ulong uVar2;
  Reader RVar3;
  
  if ((this->structDataSize == 8) && (this->structPointerCount == 0)) {
    uVar2 = (ulong)this->elementCount;
    if (uVar2 == 0) {
      asText();
    }
    else {
      pbVar1 = this->ptr;
      if (pbVar1[uVar2 - 1] == '\0') goto LAB_003ee57b;
      asText();
    }
  }
  else {
    asText();
  }
  uVar2 = 1;
  pbVar1 = "";
LAB_003ee57b:
  RVar3.super_StringPtr.content.size_ = uVar2;
  RVar3.super_StringPtr.content.ptr = (char *)pbVar1;
  return (Reader)RVar3.super_StringPtr.content;
}

Assistant:

Text::Reader ListReader::asText() {
  KJ_REQUIRE(structDataSize == G(8) * BITS && structPointerCount == ZERO * POINTERS,
             "Expected Text, got list of non-bytes.") {
    return Text::Reader();
  }

  size_t size = unbound(elementCount / ELEMENTS);

  KJ_REQUIRE(size > 0, "Message contains text that is not NUL-terminated.") {
    return Text::Reader();
  }

  const char* cptr = reinterpret_cast<const char*>(ptr);
  --size;  // NUL terminator

  KJ_REQUIRE(cptr[size] == '\0', "Message contains text that is not NUL-terminated.") {
    return Text::Reader();
  }

  return Text::Reader(cptr, size);
}